

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O3

wchar_t scp_source_setup(char *target,_Bool shouldbedir)

{
  FILE *stream;
  _Bool _Var1;
  sftp_request *req;
  sftp_packet *pktin;
  char *pcVar2;
  fxp_attrs attrs;
  fxp_attrs local_50;
  
  if (using_sftp) {
    _Var1 = fxp_init();
    stream = _stderr;
    if (!_Var1) {
      pcVar2 = fxp_error();
      tell_user(stream,"unable to initialise SFTP: %s",pcVar2);
      errs = errs + L'\x01';
      return L'\x01';
    }
    req = fxp_stat_send(target);
    pktin = sftp_wait_for_reply(req);
    _Var1 = fxp_stat_recv(pktin,req,&local_50);
    if ((_Var1) && (((byte)local_50.flags & 4) != 0)) {
      scp_sftp_targetisdir = (_Bool)((byte)((uint)local_50.permissions >> 0xe) & 1);
    }
    else {
      scp_sftp_targetisdir = false;
    }
    if ((shouldbedir) && (scp_sftp_targetisdir == false)) {
      bump("pscp: remote filespec %s: not a directory\n",target);
    }
    scp_sftp_remotepath = dupstr(target);
    scp_has_times = 0;
  }
  else {
    response();
  }
  return L'\0';
}

Assistant:

int scp_source_setup(const char *target, bool shouldbedir)
{
    if (using_sftp) {
        /*
         * Find out whether the target filespec is in fact a
         * directory.
         */
        struct sftp_packet *pktin;
        struct sftp_request *req;
        struct fxp_attrs attrs;
        bool ret;

        if (!fxp_init()) {
            tell_user(stderr, "unable to initialise SFTP: %s", fxp_error());
            errs++;
            return 1;
        }

        req = fxp_stat_send(target);
        pktin = sftp_wait_for_reply(req);
        ret = fxp_stat_recv(pktin, req, &attrs);

        if (!ret || !(attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS))
            scp_sftp_targetisdir = false;
        else
            scp_sftp_targetisdir = (attrs.permissions & 0040000) != 0;

        if (shouldbedir && !scp_sftp_targetisdir) {
            bump("pscp: remote filespec %s: not a directory\n", target);
        }

        scp_sftp_remotepath = dupstr(target);

        scp_has_times = false;
    } else {
        (void) response();
    }
    return 0;
}